

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crc32.c
# Opt level: O1

z_crc_t x2nmodp(off_t n,uint k)

{
  bool bVar1;
  uint uVar2;
  z_crc_t p;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  z_crc_t m;
  uint uVar6;
  uint uVar7;
  
  if (n != 0) {
    uVar4 = 3;
    uVar3 = 0x80000000;
    do {
      if ((n & 1U) != 0) {
        uVar6 = 0x80000000;
        uVar5 = uVar3;
        uVar3 = 0;
        while (((uVar6 & x2n_table[uVar4 & 0x1f]) == 0 ||
               (uVar3 = uVar3 ^ uVar5, (uVar6 - 1 & x2n_table[uVar4 & 0x1f]) != 0))) {
          uVar6 = uVar6 >> 1;
          uVar7 = uVar5 >> 1;
          uVar2 = uVar5 & 1;
          uVar5 = uVar7 ^ 0xedb88320;
          if (uVar2 == 0) {
            uVar5 = uVar7;
          }
        }
      }
      uVar4 = uVar4 + 1;
      bVar1 = 1 < (ulong)n;
      n = n >> 1;
    } while (bVar1);
    return uVar3;
  }
  return 0x80000000;
}

Assistant:

local z_crc_t x2nmodp(n, k)
    z_off64_t n;
    unsigned k;
{
    z_crc_t p;

    p = (z_crc_t)1 << 31;           /* x^0 == 1 */
    while (n) {
        if (n & 1)
            p = multmodp(x2n_table[k & 31], p);
        n >>= 1;
        k++;
    }
    return p;
}